

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

Vector<unsigned_int,_4> __thiscall
gl4cts::Math::convertBvecToUvec<4>(Math *this,Vector<bool,_4> *src)

{
  GLint i;
  long lVar1;
  undefined8 extraout_RDX;
  Vector<unsigned_int,_4> VVar2;
  
  tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(uint *)(this + lVar1 * 4) = (uint)src->m_data[lVar1];
  }
  VVar2.m_data[2] = (int)extraout_RDX;
  VVar2.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  VVar2.m_data._0_8_ = this;
  return (Vector<unsigned_int,_4>)VVar2.m_data;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> convertBvecToUvec(const tcu::Vector<bool, Size>& src)
{
	tcu::Vector<glw::GLuint, Size> result;

	for (glw::GLint i = 0; i < Size; ++i)
	{
		if (GL_FALSE != src[i])
		{
			result[i] = 1;
		}
		else
		{
			result[i] = 0;
		}
	}

	return result;
}